

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnBrOnExnExpr
          (ExprVisitorDelegate *this,BrOnExnExpr *expr)

{
  WatWriter *this_00;
  char *local_50;
  
  this_00 = this->writer_;
  Opcode::GetInfo((Opcode *)&Opcode::BrOnExn_Opcode);
  WritePuts(this_00,local_50,Space);
  WriteBrVar(this->writer_,&expr->label_var,Space);
  WriteVar(this->writer_,&expr->event_var,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnBrOnExnExpr(BrOnExnExpr* expr) {
  writer_->WritePutsSpace(Opcode::BrOnExn_Opcode.GetName());
  writer_->WriteBrVar(expr->label_var, NextChar::Space);
  writer_->WriteVar(expr->event_var, NextChar::Newline);
  return Result::Ok;
}